

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

char * icu_63::TimeZone::getTZDataVersion(UErrorCode *status)

{
  UBool UVar1;
  UResourceBundle *resB;
  UChar *us;
  int32_t len;
  int32_t local_1c;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((gTZDataVersionInitOnce.fState.super___atomic_base<int>._M_i == 2) ||
       (UVar1 = umtx_initImplPreInit(&gTZDataVersionInitOnce), UVar1 == '\0')) {
      if (U_ZERO_ERROR < gTZDataVersionInitOnce.fErrCode) {
        *status = gTZDataVersionInitOnce.fErrCode;
      }
    }
    else {
      ucln_i18n_registerCleanup_63(UCLN_I18N_TIMEZONE,timeZone_cleanup);
      local_1c = 0;
      resB = ures_openDirect_63((char *)0x0,"zoneinfo64",status);
      us = ures_getStringByKey_63(resB,"TZVersion",&local_1c,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        if (0xf < local_1c) {
          local_1c = 0xf;
        }
        u_UCharsToChars_63(us,TZDATA_VERSION,local_1c);
      }
      ures_close_63(resB);
      gTZDataVersionInitOnce.fErrCode = *status;
      umtx_initImplPostInit(&gTZDataVersionInitOnce);
    }
  }
  return TZDATA_VERSION;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }